

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Program.cpp
# Opt level: O1

Program * __thiscall soul::Program::operator=(Program *this,Program *param_1)

{
  ProgramImpl *pPVar1;
  ProgramImpl *o;
  
  this->pimpl = param_1->pimpl;
  pPVar1 = (param_1->refHolder).object;
  if (pPVar1 != (ProgramImpl *)0x0) {
    (pPVar1->super_RefCountedObject).refCount = (pPVar1->super_RefCountedObject).refCount + 1;
  }
  o = (this->refHolder).object;
  (this->refHolder).object = pPVar1;
  RefCountedPtr<soul::Program::ProgramImpl>::decIfNotNull(o);
  return this;
}

Assistant:

Program Program::createFromHEART (CompileMessageList& messageList, CodeLocation heartCode)
{
    try
    {
        CompileMessageHandler handler (messageList);
        auto program = heart::Parser::parse (std::move (heartCode));
        heart::Checker::sanityCheck (program);
        return program;
    }
    catch (AbortCompilationException) {}

    return {};
}